

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::OndiskReader::Reset(OndiskReader *this)

{
  ostream *poVar1;
  string *in_RDI;
  int unaff_retaddr;
  string *in_stack_00000008;
  LogSeverity in_stack_00000014;
  int ret;
  Logger *in_stack_ffffffffffffff90;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Logger local_10;
  int local_c;
  
  local_c = fseek(*(FILE **)(in_RDI + 0xd8),0,0);
  if (local_c != 0) {
    Logger::Logger(&local_10,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
               ,&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Reset",(allocator *)&stack0xffffffffffffff97);
    poVar1 = Logger::Start(in_stack_00000014,in_stack_00000008,unaff_retaddr,in_RDI);
    std::operator<<(poVar1,"Fail to return to the head of file.");
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    Logger::~Logger(in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void OndiskReader::Reset() {
  int ret = fseek(file_ptr_, 0, SEEK_SET);
  if (ret != 0) {
    LOG(FATAL) << "Fail to return to the head of file.";
  }
}